

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O0

void google::protobuf::compiler::java::WriteDeprecatedJavadoc
               (Printer *printer,FieldDescriptor *field,FieldAccessorType type,Options *options)

{
  bool bVar1;
  FieldOptions *this;
  FileDescriptor *this_00;
  string_view local_128;
  string_view local_118;
  string_view local_108;
  string_view local_f8;
  string local_e8;
  undefined1 local_c8 [8];
  SourceLocation location;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string startLine;
  Options *options_local;
  FieldAccessorType type_local;
  FieldDescriptor *field_local;
  Printer *printer_local;
  
  startLine.field_2._8_8_ = options;
  this = FieldDescriptor::options(field);
  bVar1 = FieldOptions::deprecated(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"0",&local_49);
    std::allocator<char>::~allocator(&local_49);
    SourceLocation::SourceLocation((SourceLocation *)local_c8);
    bVar1 = FieldDescriptor::GetSourceLocation(field,(SourceLocation *)local_c8);
    if (bVar1) {
      std::__cxx11::to_string(&local_e8,local_c8._0_4_);
      std::__cxx11::string::operator=((string *)local_48,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_f8," * @deprecated $name$ is deprecated.\n");
    local_108 = FieldDescriptor::full_name(field);
    io::Printer::Print<char[5],std::basic_string_view<char,std::char_traits<char>>>
              (printer,local_f8,(char (*) [5])0xc259cc,&local_108);
    if ((options->strip_nonfunctional_codegen & 1U) == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_118," *     See $file$;l=$line$\n");
      this_00 = FieldDescriptor::file(field);
      local_128 = FileDescriptor::name(this_00);
      io::Printer::
      Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string>
                (printer,local_118,(char (*) [5])0x9ff500,&local_128,(char (*) [5])0xc0ee50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    }
    SourceLocation::~SourceLocation((SourceLocation *)local_c8);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void WriteDeprecatedJavadoc(io::Printer* printer, const FieldDescriptor* field,
                            const FieldAccessorType type,
                            const Options options) {
  if (!field->options().deprecated()) {
    return;
  }

  std::string startLine = "0";
  SourceLocation location;
  if (field->GetSourceLocation(&location)) {
    startLine = std::to_string(location.start_line);
  }

  printer->Print(" * @deprecated $name$ is deprecated.\n", "name",
                 field->full_name());
  if (!options.strip_nonfunctional_codegen) {
    printer->Print(" *     See $file$;l=$line$\n", "file",
                   field->file()->name(), "line", startLine);
  }
}